

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqfuncstate.cpp
# Opt level: O3

SQFuncState * __thiscall SQFuncState::PushChildState(SQFuncState *this,SQSharedState *ss)

{
  ulong uVar1;
  SQFuncState *this_00;
  SQFuncState **p;
  ulong uVar2;
  SQUnsignedInteger SVar3;
  
  this_00 = (SQFuncState *)sq_malloc(0x210);
  SQFuncState(this_00,ss,this,this->_errfunc,this->_errtarget);
  uVar1 = (this->_childstates)._allocated;
  p = (this->_childstates)._vals;
  uVar2 = (this->_childstates)._size;
  if (uVar1 <= uVar2) {
    SVar3 = 4;
    if (uVar2 * 2 != 0) {
      SVar3 = uVar2 * 2;
    }
    p = (SQFuncState **)sq_vm_realloc(p,uVar1 << 3,SVar3 * 8);
    (this->_childstates)._vals = p;
    (this->_childstates)._allocated = SVar3;
    uVar2 = (this->_childstates)._size;
  }
  (this->_childstates)._size = uVar2 + 1;
  p[uVar2] = this_00;
  return this_00;
}

Assistant:

SQFuncState *SQFuncState::PushChildState(SQSharedState *ss)
{
    SQFuncState *child = (SQFuncState *)sq_malloc(sizeof(SQFuncState));
    new (child) SQFuncState(ss,this,_errfunc,_errtarget);
    _childstates.push_back(child);
    return child;
}